

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::deriv
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nderiv)

{
  double dVar1;
  double dVar2;
  Index IVar3;
  Scalar *pSVar4;
  size_t sVar5;
  ulong index;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  size_t N;
  vectype c;
  vectype cd;
  
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&c,(DenseStorage<double,__1,__1,_1,_0> *)this);
  sVar5 = 0;
  do {
    IVar3 = c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (sVar5 == Nderiv) {
      ChebyshevExpansion(__return_storage_ptr__,&c,this->m_xmin,this->m_xmax);
      break;
    }
    N = c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows - 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&cd,&N);
    lVar8 = 2;
    index = 0;
    while (index <= IVar3 - 2U) {
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&cd,index);
      *pSVar4 = 0.0;
      lVar7 = lVar8;
      for (uVar6 = 1; uVar6 + index <= N; uVar6 = uVar6 + 1) {
        if ((uVar6 & 1) != 0) {
          auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
          auVar9._0_8_ = lVar7;
          auVar9._12_4_ = 0x45300000;
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&c,
                              uVar6 + index);
          dVar1 = *pSVar4;
          pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&cd,
                              index);
          *pSVar4 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * dVar1 +
                    *pSVar4;
        }
        lVar7 = lVar7 + 2;
      }
      if (index == 0) {
        pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&cd,0);
        *pSVar4 = *pSVar4 * 0.5;
      }
      dVar1 = this->m_xmin;
      dVar2 = this->m_xmax;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&cd,index);
      *pSVar4 = *pSVar4 / ((dVar2 - dVar1) * 0.5);
      lVar8 = lVar8 + 2;
      index = index + 1;
    }
    if (Nderiv == 1) {
      ChebyshevExpansion(__return_storage_ptr__,&cd,this->m_xmin,this->m_xmax);
    }
    else {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)&c,(Matrix<double,__1,_1,_0,__1,_1> *)&cd);
    }
    free(cd.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    sVar5 = sVar5 + 1;
  } while (Nderiv != 1);
  free(c.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::deriv(std::size_t Nderiv) const {
        // See Mason and Handscomb, p. 34, Eq. 2.52
        // and example in https ://github.com/numpy/numpy/blob/master/numpy/polynomial/chebyshev.py#L868-L964
        vectype c = m_c;
        for (std::size_t deriv_counter = 0; deriv_counter < Nderiv; ++deriv_counter) {
            std::size_t N = c.size() - 1, ///< Order of the expansion
                        Nd = N - 1; ///< Order of the derivative expansion
            vectype cd(N);
            for (std::size_t r = 0; r <= Nd; ++r) {
                cd(r) = 0;
                for (std::size_t k = r + 1; k <= N; ++k) {
                    // Terms where k-r is odd have values, otherwise, they are zero
                    if ((k - r) % 2 == 1) {
                        cd(r) += 2*k*c(k);
                    }
                }
                // The first term with r = 0 is divided by 2 (the single prime in Mason and Handscomb, p. 34, Eq. 2.52)
                if (r == 0) {
                    cd(r) /= 2;
                }
                // Rescale the values if the range is not [-1,1].  Arrives from the derivative of d(xreal)/d(x_{-1,1})
                cd(r) /= (m_xmax-m_xmin)/2.0;
            }
            if (Nderiv == 1) {
                return ChebyshevExpansion(std::move(cd), m_xmin, m_xmax);
            }
            else{
                c = cd;
            }
        }
        return ChebyshevExpansion(std::move(c), m_xmin, m_xmax);
    }